

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-test.cc
# Opt level: O1

void __thiscall MemoryBufferTest_MoveCtor_Test::TestBody(MemoryBufferTest_MoveCtor_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertionResult gtest_ar_1;
  allocator<char> alloc;
  AssertionResult gtest_ar;
  char *inline_buffer_ptr;
  AssertHelper local_c8;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c0;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b8;
  allocator<char> local_a9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_memory_buffer<char,_5UL,_allocator_ref<std::allocator<char>_>_> local_88;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *local_58;
  basic_memory_buffer<char,_5UL,_allocator_ref<std::allocator<char>_>_> local_50;
  
  local_88.super_allocator_ref<std::allocator<char>_>.alloc_ = &local_a9;
  local_88.super_basic_buffer<char>.size_ = 4;
  local_88.super_basic_buffer<char>.capacity_ = 5;
  local_88.super_basic_buffer<char>._vptr_basic_buffer = (_func_int **)&PTR_grow_002a85d8;
  builtin_strncpy(local_88.store_,"test",4);
  local_88.super_basic_buffer<char>.ptr_ = local_88.store_;
  check_move_buffer("test",&local_88);
  if (local_88.super_basic_buffer<char>.capacity_ < local_88.super_basic_buffer<char>.size_ + 1) {
    (**local_88.super_basic_buffer<char>._vptr_basic_buffer)();
  }
  *(basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
   (local_88.super_basic_buffer<char>.ptr_ + local_88.super_basic_buffer<char>.size_) =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>)0x61;
  local_88.super_basic_buffer<char>.size_ = local_88.super_basic_buffer<char>.size_ + 1;
  check_move_buffer("testa",&local_88);
  local_58 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
             local_88.super_basic_buffer<char>.ptr_;
  if (local_88.super_basic_buffer<char>.capacity_ < local_88.super_basic_buffer<char>.size_ + 1) {
    (**local_88.super_basic_buffer<char>._vptr_basic_buffer)();
  }
  *(basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
   (local_88.super_basic_buffer<char>.ptr_ + local_88.super_basic_buffer<char>.size_) =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>)0x62;
  local_50.super_basic_buffer<char>.capacity_ = 0;
  local_50.super_allocator_ref<std::allocator<char>_>.alloc_ = (allocator<char> *)0x0;
  local_50.super_basic_buffer<char>.ptr_ = (char *)0x0;
  local_50.super_basic_buffer<char>.size_ = 0;
  local_50.super_basic_buffer<char>._vptr_basic_buffer = (_func_int **)&PTR_grow_002a85d8;
  local_88.super_basic_buffer<char>.size_ = local_88.super_basic_buffer<char>.size_ + 1;
  fmt::v5::basic_memory_buffer<char,_5UL,_allocator_ref<std::allocator<char>_>_>::move
            (&local_50,&local_88);
  local_c0.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       local_88.super_basic_buffer<char>.ptr_;
  testing::internal::CmpHelperEQ<char_const*,char*>
            ((internal *)&local_a8,"inline_buffer_ptr","&buffer[0]",(char **)&local_58,
             (char **)&local_c0);
  if ((char)local_a8._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_c0);
    if ((undefined8 *)local_a8._M_string_length == (undefined8 *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)local_a8._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x13c,pcVar2);
    testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_c0);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    if (local_c0.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_c0.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_c0.ptr_ + 8))();
      }
      local_c0.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_a8._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_a8,local_50.super_basic_buffer<char>.ptr_,
             local_50.super_basic_buffer<char>.ptr_ + local_50.super_basic_buffer<char>.size_);
  testing::internal::CmpHelperEQ<char[7],std::__cxx11::string>
            ((internal *)&local_c0,"\"testab\"","std::string(&buffer2[0], buffer2.size())",
             (char (*) [7])"testab",&local_a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  if (local_c0.ptr_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_a8);
    if (local_b8.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_b8.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x13d,pcVar2);
    testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0)) {
        (**(code **)(*(size_type *)local_a8._M_dataplus._M_p + 8))();
      }
      local_a8._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_b8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_c0.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       local_50.super_basic_buffer<char>.capacity_;
  local_c8.data_._0_4_ = 5;
  testing::internal::CmpHelperGT<unsigned_long,unsigned_int>
            ((internal *)&local_a8,"buffer2.capacity()","5u",(unsigned_long *)&local_c0,
             (uint *)&local_c8);
  if ((char)local_a8._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_c0);
    if ((undefined8 *)local_a8._M_string_length == (undefined8 *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)local_a8._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x13e,pcVar2);
    testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_c0);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    if (local_c0.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_c0.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_c0.ptr_ + 8))();
      }
      local_c0.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_a8._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_50.super_basic_buffer<char>._vptr_basic_buffer = (_func_int **)&PTR_grow_002a85d8;
  if (local_50.super_basic_buffer<char>.ptr_ != local_50.store_) {
    operator_delete(local_50.super_basic_buffer<char>.ptr_);
  }
  local_88.super_basic_buffer<char>._vptr_basic_buffer = (_func_int **)&PTR_grow_002a85d8;
  if (local_88.super_basic_buffer<char>.ptr_ != local_88.store_) {
    operator_delete(local_88.super_basic_buffer<char>.ptr_);
  }
  return;
}

Assistant:

TEST(MemoryBufferTest, MoveCtor) {
  std::allocator<char> alloc;
  basic_memory_buffer<char, 5, TestAllocator> buffer((TestAllocator(&alloc)));
  const char test[] = "test";
  buffer.append(test, test + 4);
  check_move_buffer("test", buffer);
  // Adding one more character fills the inline buffer, but doesn't cause
  // dynamic allocation.
  buffer.push_back('a');
  check_move_buffer("testa", buffer);
  const char *inline_buffer_ptr = &buffer[0];
  // Adding one more character causes the content to move from the inline to
  // a dynamically allocated buffer.
  buffer.push_back('b');
  basic_memory_buffer<char, 5, TestAllocator> buffer2(std::move(buffer));
  // Move should rip the guts of the first buffer.
  EXPECT_EQ(inline_buffer_ptr, &buffer[0]);
  EXPECT_EQ("testab", std::string(&buffer2[0], buffer2.size()));
  EXPECT_GT(buffer2.capacity(), 5u);
}